

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# respond.c
# Opt level: O1

void resp0_ctx_recv(void *arg,nni_aio *aio)

{
  nni_list *list;
  nni_mtx *mtx;
  _Bool _Var1;
  int iVar2;
  undefined8 *item;
  nni_msg *m;
  size_t sVar3;
  void *__src;
  nni_aio *aio_00;
  
  mtx = *arg;
  nni_mtx_lock(mtx);
  list = (nni_list *)(&mtx[6].mtx.__align + 1);
  item = (undefined8 *)nni_list_first(list);
  if (item != (undefined8 *)0x0) {
    aio_00 = (nni_aio *)(item + 0x3f);
    m = nni_aio_get_msg(aio_00);
    nni_aio_set_msg(aio_00,(nni_msg *)0x0);
    nni_list_remove(list,item);
    iVar2 = nni_list_empty(list);
    if (iVar2 != 0) {
      nni_pollable_clear((nni_pollable *)((long)&mtx[7].mtx + 0x10));
    }
    nni_pipe_recv((nni_pipe *)*item,aio_00);
    sVar3 = nni_msg_header_len(m);
    __src = nni_msg_header(m);
    memcpy((void *)((long)arg + 0x50),__src,sVar3);
    *(size_t *)((long)arg + 0x48) = sVar3;
    *(undefined4 *)((long)arg + 8) = *(undefined4 *)((long)item + 0x14);
    if ((void *)((long)&mtx[2].mtx + 0x18) == arg) {
      nni_pollable_raise((nni_pollable *)&mtx[7].mtx.__data.__list.__next);
    }
    nni_mtx_unlock(mtx);
    nni_msg_header_clear(m);
    nni_aio_set_msg(aio,m);
    sVar3 = nni_msg_len(m);
    nni_aio_finish(aio,NNG_OK,sVar3);
    return;
  }
  _Var1 = nni_aio_start(aio,resp0_cancel_recv,arg);
  if (_Var1) {
    if (*(long *)((long)arg + 0x20) != 0) {
      nni_mtx_unlock(mtx);
      nni_aio_finish_error(aio,NNG_ESTATE);
      return;
    }
    *(nni_aio **)((long)arg + 0x20) = aio;
    nni_list_append((nni_list *)&mtx[6].mtx.__data.__list.__next,arg);
  }
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

static void
resp0_ctx_recv(void *arg, nni_aio *aio)
{
	resp0_ctx  *ctx = arg;
	resp0_sock *s   = ctx->sock;
	resp0_pipe *p;
	size_t      len;
	nni_msg    *msg;

	nni_mtx_lock(&s->mtx);
	if ((p = nni_list_first(&s->recvpipes)) == NULL) {
		if (!nni_aio_start(aio, resp0_cancel_recv, ctx)) {
			nni_mtx_unlock(&s->mtx);
			return;
		}
		// We cannot have two concurrent receive requests on the same
		// context...
		if (ctx->raio != NULL) {
			nni_mtx_unlock(&s->mtx);
			nni_aio_finish_error(aio, NNG_ESTATE);
			return;
		}
		ctx->raio = aio;
		nni_list_append(&s->recvq, ctx);
		nni_mtx_unlock(&s->mtx);
		return;
	}
	msg = nni_aio_get_msg(&p->aio_recv);
	nni_aio_set_msg(&p->aio_recv, NULL);
	nni_list_remove(&s->recvpipes, p);
	if (nni_list_empty(&s->recvpipes)) {
		nni_pollable_clear(&s->readable);
	}
	nni_pipe_recv(p->npipe, &p->aio_recv);

	len = nni_msg_header_len(msg);
	memcpy(ctx->btrace, nni_msg_header(msg), len);
	ctx->btrace_len = len;
	ctx->pipe_id    = p->id;
	if (ctx == &s->ctx) {
		nni_pollable_raise(&s->writable);
	}
	nni_mtx_unlock(&s->mtx);

	nni_msg_header_clear(msg);
	nni_aio_set_msg(aio, msg);
	nni_aio_finish(aio, 0, nni_msg_len(msg));
}